

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

int main(void)

{
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> vec;
  allocator_type local_51;
  vector<int,_std::allocator<int>_> local_50;
  int local_38 [12];
  
  local_38[4] = 0x20;
  local_38[5] = 1;
  local_38[6] = 0x2e;
  local_38[7] = 99999;
  local_38[0] = 0x59;
  local_38[1] = 0x4e;
  local_38[2] = 0x43;
  local_38[3] = 1;
  local_38[8] = 0x3e0;
  __l._M_len = 9;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector(&local_50,__l,&local_51);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Before: ",8);
  show(&local_50);
  insertionSort<int>(&local_50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"After: ",7);
  show(&local_50);
  if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main()
{
    vector<int> vec = {89, 78, 67, 1, 32, 1, 46, 99999, 992};
    cout << "Before: ";
    show(vec);
    insertionSort(vec);
    cout << "After: ";
    show(vec);
    return 0;
}